

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void __thiscall EDCircles::EDCircles(EDCircles *this,Mat *srcImage)

{
  undefined8 *puVar1;
  pointer pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  pointer pLVar12;
  bool bVar13;
  Circle *pCVar14;
  pointer *ppPVar15;
  int *piVar16;
  BufferManager *pBVar17;
  double *pdVar18;
  Info *pIVar19;
  EDArcs *pEVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  double *x;
  undefined4 uVar29;
  double tmp;
  undefined4 uVar30;
  double major;
  double yc;
  double circleFitError;
  double r;
  vector<LineSegment,_std::allocator<LineSegment>_> lines;
  double minor;
  double xc;
  EllipseEquation eq;
  double local_198;
  double local_190;
  double local_188;
  Mat *local_180;
  vector<LineSegment,_std::allocator<LineSegment>_> local_178;
  double local_160;
  mEllipse local_158;
  int *local_130;
  vector<mEllipse,_std::allocator<mEllipse>_> *local_128;
  vector<mCircle,_std::allocator<mCircle>_> *local_120;
  double local_118;
  double local_110;
  EllipseEquation local_108;
  Mat *local_c8;
  double local_c0;
  long local_b8;
  vector<LineSegment,_std::allocator<LineSegment>_> local_b0;
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,srcImage);
  EDPF::EDPF(&this->super_EDPF,local_90);
  cv::Mat::~Mat(local_90);
  local_120 = &this->circles;
  local_128 = &this->ellipses;
  this->noCircles1 = 0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->circles).super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ellipses).super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar24 = (this->super_EDPF).super_ED.height + (this->super_EDPF).super_ED.width;
  uVar27 = (ulong)(iVar24 * 8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar27;
  uVar23 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x98),8) == 0) {
    uVar23 = SUB168(auVar3 * ZEXT816(0x98),0);
  }
  pCVar14 = (Circle *)operator_new__(uVar23);
  if (iVar24 != 0) {
    lVar25 = 0;
    do {
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x30) = 0;
      lVar25 = lVar25 + 0x98;
    } while (uVar27 * 0x98 - lVar25 != 0);
  }
  this->circles1 = pCVar14;
  pvVar2 = (this->super_EDPF).super_ED.segmentPoints.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar25 = (long)(this->super_EDPF).super_ED.segmentPoints.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar25 == 0) {
    iVar24 = 0;
  }
  else {
    lVar25 = (lVar25 >> 3) * -0x5555555555555555;
    lVar25 = lVar25 + (ulong)(lVar25 == 0);
    ppPVar15 = (pointer *)
               ((long)&(pvVar2->
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                       _M_impl.super__Vector_impl_data + 8);
    iVar24 = 0;
    do {
      iVar24 = iVar24 + (int)((ulong)((long)*ppPVar15 -
                                     (long)((_Vector_impl_data *)(ppPVar15 + -1))->_M_start) >> 3);
      ppPVar15 = ppPVar15 + 3;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
  }
  lVar25 = (long)(this->super_EDPF).super_ED.segmentNos;
  uVar23 = 0xffffffffffffffff;
  if (-2 < lVar25) {
    uVar23 = lVar25 * 4 + 4;
  }
  local_c8 = srcImage;
  piVar16 = (int *)operator_new__(uVar23);
  this->segmentStartLines = piVar16;
  pBVar17 = (BufferManager *)operator_new(0x18);
  uVar23 = 0xffffffffffffffff;
  if (-1 < iVar24) {
    uVar23 = (long)(iVar24 * 8) << 3;
  }
  pdVar18 = (double *)operator_new__(uVar23);
  pBVar17->x = pdVar18;
  pdVar18 = (double *)operator_new__(uVar23);
  local_130 = &this->noCircles1;
  pBVar17->y = pdVar18;
  pBVar17->index = 0;
  this->bm = pBVar17;
  local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar24 = (this->super_EDPF).super_ED.segmentNos;
  if (0 < iVar24) {
    lVar25 = 0;
    do {
      this->segmentStartLines[lVar25] =
           (int)((ulong)((long)local_178.
                               super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)local_178.
                              super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      pvVar2 = (this->super_EDPF).super_ED.segmentPoints.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar26 = *(long *)&pvVar2[lVar25].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data;
      uVar21 = (uint)((long)*(pointer *)
                             ((long)&pvVar2[lVar25].
                                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                     ._M_impl.super__Vector_impl_data + 8) - lVar26 >> 3);
      if (0xb < (int)uVar21) {
        pBVar17 = this->bm;
        x = pBVar17->x + pBVar17->index;
        pdVar18 = pBVar17->y + pBVar17->index;
        uVar23 = 0;
        do {
          x[uVar23] = (double)*(int *)(lVar26 + uVar23 * 8);
          pdVar18[uVar23] = (double)*(int *)(lVar26 + 4 + uVar23 * 8);
          uVar23 = uVar23 + 1;
        } while ((uVar21 & 0x7fffffff) != uVar23);
        if (0x17 < (int)uVar21) {
          dVar6 = (*x - x[uVar21 - 1]) * (*x - x[uVar21 - 1]) +
                  (*pdVar18 - pdVar18[uVar21 - 1]) * (*pdVar18 - pdVar18[uVar21 - 1]);
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          dVar8 = ((double)(int)uVar21 / 6.283185307179586) * 0.25;
          if (dVar8 <= 3.0) {
            dVar8 = 3.0;
          }
          if (dVar8 < dVar6) {
LAB_0010ae77:
            iVar24 = 0;
          }
          else {
            local_188 = 10000000000.0;
            CircleFit(x,pdVar18,uVar21,(double *)&local_158,&local_190,(double *)&local_180,
                      &local_188);
            dVar6 = local_188;
            local_108.coeff[4] = 0.0;
            local_108.coeff[5] = 0.0;
            local_108.coeff[2] = 0.0;
            local_108.coeff[3] = 0.0;
            local_108.coeff[0] = 0.0;
            local_108.coeff[1] = 0.0;
            local_108.coeff[6] = 0.0;
            uVar29 = 0x20000000;
            uVar30 = 0x4202a05f;
            if (1.5 < local_188) {
              bVar13 = EllipseFit(x,pdVar18,uVar21,&local_108,1);
              uVar29 = 0x20000000;
              uVar30 = 0x4202a05f;
              if (bVar13) {
                dVar8 = ComputeEllipseError(&local_108,x,pdVar18,uVar21);
                uVar29 = SUB84(dVar8,0);
                uVar30 = (undefined4)((ulong)dVar8 >> 0x20);
              }
            }
            if (dVar6 <= 1.5) {
              pCVar14 = this->circles1;
              iVar24 = this->noCircles1;
              pCVar14[iVar24].xc = local_158.center.x;
              pCVar14[iVar24].yc = local_190;
              pCVar14[iVar24].r = (double)local_180;
              pCVar14[iVar24].circleFitError = dVar6;
              pCVar14[iVar24].coverRatio =
                   (double)(int)uVar21 / ((double)local_180 * 6.283185307179586);
              pCVar14[iVar24].x = x;
              pCVar14[iVar24].y = pdVar18;
              pCVar14[iVar24].noPixels = uVar21;
              iVar24 = this->noCircles1;
              pCVar14[iVar24].isEllipse = false;
              this->noCircles1 = iVar24 + 1;
              pBVar17 = this->bm;
LAB_0010ae68:
              pBVar17->index = pBVar17->index + uVar21;
LAB_0010ae6c:
              iVar24 = 7;
              bVar13 = false;
            }
            else {
              if ((double)CONCAT44(uVar30,uVar29) <= 1.5) {
                ComputeEllipseCenterAndAxisLengths
                          (&local_108,(double *)&local_158,&local_190,&local_198,&local_160);
                dVar8 = local_198;
                if (local_198 < local_160) {
                  local_198 = local_160;
                  local_160 = dVar8;
                }
                if (local_198 < local_160 * 8.0) {
                  addCircle(this->circles1,local_130,local_158.center.x,local_190,(double)local_180,
                            dVar6,&local_108,(double)CONCAT44(uVar30,uVar29),x,pdVar18,uVar21);
                  pBVar17 = this->bm;
                  goto LAB_0010ae68;
                }
                goto LAB_0010ae6c;
              }
              iVar24 = 0;
              bVar13 = true;
            }
            if (bVar13) goto LAB_0010ae77;
          }
          if (iVar24 != 0) goto LAB_0010ae9e;
        }
        EDLines::SplitSegment2Lines(x,pdVar18,uVar21,(int)lVar25,&local_178,6,1.0);
      }
LAB_0010ae9e:
      lVar25 = lVar25 + 1;
      iVar24 = (this->super_EDPF).super_ED.segmentNos;
    } while (lVar25 < iVar24);
  }
  uVar23 = ((long)local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  this->segmentStartLines[iVar24] = (int)uVar23;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar23;
  uVar23 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
    uVar23 = SUB168(auVar4 * ZEXT816(0x18),0);
  }
  pIVar19 = (Info *)operator_new__(uVar23);
  this->info = pIVar19;
  if (0 < (this->super_EDPF).super_ED.segmentNos) {
    lVar25 = 0;
    do {
      piVar16 = this->segmentStartLines;
      lVar26 = (long)piVar16[lVar25];
      lVar28 = lVar25 + 1;
      uVar23 = (ulong)(uint)piVar16[lVar25 + 1];
      local_b8 = lVar25;
      if (piVar16[lVar25] < piVar16[lVar25 + 1]) {
        lVar25 = lVar26 * 0x18;
        lVar10 = lVar26 * 0x48;
        do {
          pLVar12 = local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar11 = lVar10 + 0x48;
          if ((int)lVar26 == (int)uVar23 + -1) {
            lVar11 = (long)piVar16[local_b8] * 0x48;
          }
          dVar6 = *(double *)
                   ((long)&(local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->ex + lVar10) -
                  *(double *)
                   ((long)&(local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->sx + lVar11);
          dVar8 = *(double *)
                   ((long)&(local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->ey + lVar10) -
                  *(double *)
                   ((long)&(local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>.
                            _M_impl.super__Vector_impl_data._M_start)->sy + lVar11);
          dVar6 = dVar6 * dVar6 + dVar8 * dVar8;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          if (15.0 <= dVar6) {
            pIVar19 = this->info;
            *(undefined8 *)((long)&pIVar19->angle + lVar25) = 0x4024000000000000;
            uVar21 = 2;
          }
          else {
            dVar6 = *(double *)((long)&pLVar12->ex + lVar10) -
                    *(double *)((long)&pLVar12->sx + lVar10);
            dVar9 = *(double *)((long)&pLVar12->ey + lVar10) -
                    *(double *)((long)&pLVar12->sy + lVar10);
            dVar8 = dVar6 * dVar6 + dVar9 * dVar9;
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            local_118 = *(double *)((long)&pLVar12->ex + lVar11) -
                        *(double *)((long)&pLVar12->sx + lVar11);
            local_110 = *(double *)((long)&pLVar12->ey + lVar11) -
                        *(double *)((long)&pLVar12->sy + lVar11);
            dVar7 = local_118 * local_118 + local_110 * local_110;
            if (dVar7 < 0.0) {
              local_c0 = dVar8;
              dVar7 = sqrt(dVar7);
              dVar8 = local_c0;
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            dVar8 = (dVar6 * local_118 + dVar9 * local_110) / (dVar8 * dVar7);
            dVar7 = 1.0;
            if ((dVar8 <= 1.0) && (dVar7 = dVar8, dVar8 < -1.0)) {
              dVar7 = -1.0;
            }
            dVar8 = acos(dVar7);
            pIVar19 = this->info;
            *(double *)((long)&pIVar19->angle + lVar25) = dVar8;
            uVar21 = -(uint)(dVar6 * local_110 - dVar9 * local_118 < 0.0) | 1;
          }
          *(uint *)((long)&pIVar19->sign + lVar25) = uVar21;
          (&pIVar19->taken)[lVar25] = false;
          lVar26 = lVar26 + 1;
          piVar16 = this->segmentStartLines;
          uVar23 = (ulong)piVar16[lVar28];
          lVar25 = lVar25 + 0x18;
          lVar10 = lVar10 + 0x48;
        } while (lVar26 < (long)uVar23);
      }
      lVar25 = lVar28;
    } while (lVar28 < (this->super_EDPF).super_ED.segmentNos);
  }
  uVar23 = (long)local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                 super__Vector_impl_data._M_start;
  iVar24 = *local_130;
  pEVar20 = (EDArcs *)operator_new(0x10);
  iVar24 = ((int)(uVar23 >> 3) * 0x38e38e39) / 3 + iVar24 * 2;
  EDArcs::EDArcs(pEVar20,iVar24);
  this->edarcs1 = pEVar20;
  std::vector<LineSegment,_std::allocator<LineSegment>_>::vector(&local_b0,&local_178);
  DetectArcs(this,&local_b0);
  if (local_b0.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pEVar20 = (EDArcs *)operator_new(0x10);
  EDArcs::EDArcs(pEVar20,iVar24);
  this->edarcs2 = pEVar20;
  JoinArcs1(this);
  pEVar20 = (EDArcs *)operator_new(0x10);
  EDArcs::EDArcs(pEVar20,iVar24);
  this->edarcs3 = pEVar20;
  JoinArcs2(this);
  pEVar20 = (EDArcs *)operator_new(0x10);
  EDArcs::EDArcs(pEVar20,iVar24);
  this->edarcs4 = pEVar20;
  JoinArcs3(this);
  GenerateCandidateCircles(this);
  this->noCircles2 = 0;
  uVar27 = (ulong)iVar24;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar27;
  uVar23 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x98),8) == 0) {
    uVar23 = SUB168(auVar5 * ZEXT816(0x98),0);
  }
  pCVar14 = (Circle *)operator_new__(uVar23);
  if (iVar24 != 0) {
    lVar25 = 0;
    do {
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x30) = 0;
      lVar25 = lVar25 + 0x98;
    } while (uVar27 * 0x98 - lVar25 != 0);
  }
  this->circles2 = pCVar14;
  local_108.coeff[2] = 0.0;
  local_108.coeff[0] = (double)CONCAT44(local_108.coeff[0]._4_4_,0x1010000);
  local_108.coeff[1] = (double)local_c8;
  local_158.center.y = (double)&(this->super_EDPF).super_ED.smoothImage;
  local_158.axes.width = 0;
  local_158.axes.height = 0;
  local_158.center.x = (double)CONCAT44(local_158.center.x._4_4_,0x2010000);
  local_98 = 0;
  cv::GaussianBlur(0,0);
  ValidateCircles(this);
  this->noCircles3 = 0;
  pCVar14 = (Circle *)operator_new__(uVar23);
  if (iVar24 != 0) {
    lVar25 = 0;
    do {
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pCVar14->eq).coeff + lVar25);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pCVar14->eq).coeff + lVar25 + 0x30) = 0;
      lVar25 = lVar25 + 0x98;
    } while (uVar27 * 0x98 - lVar25 != 0);
  }
  this->circles3 = pCVar14;
  JoinCircles(this);
  this->noEllipses = 0;
  this->noCircles = 0;
  if (0 < (long)this->noCircles3) {
    iVar24 = this->noEllipses;
    iVar22 = this->noCircles;
    lVar25 = 0;
    do {
      if (*(char *)((long)(&this->circles3->eq + 1) + lVar25 + 8) == '\x01') {
        iVar24 = iVar24 + 1;
        this->noEllipses = iVar24;
      }
      else {
        iVar22 = iVar22 + 1;
        this->noCircles = iVar22;
      }
      lVar25 = lVar25 + 0x98;
    } while ((long)this->noCircles3 * 0x98 - lVar25 != 0);
  }
  if (0 < this->noCircles3) {
    lVar25 = 0;
    lVar26 = 0;
    do {
      pCVar14 = this->circles3;
      if (*(char *)((long)(&pCVar14->eq + 1) + lVar25 + 8) == '\x01') {
        local_108.coeff[6] = *(double *)((long)(pCVar14->eq).coeff + lVar25 + 0x30);
        pdVar18 = (double *)((long)(pCVar14->eq).coeff + lVar25);
        local_108.coeff[0] = *pdVar18;
        local_108.coeff[1] = pdVar18[1];
        pdVar18 = (double *)((long)(pCVar14->eq).coeff + lVar25 + 0x10);
        local_108.coeff[2] = *pdVar18;
        local_108.coeff[3] = pdVar18[1];
        pdVar18 = (double *)((long)(pCVar14->eq).coeff + lVar25 + 0x20);
        local_108.coeff[4] = *pdVar18;
        local_108.coeff[5] = pdVar18[1];
        local_158.theta =
             ComputeEllipseCenterAndAxisLengths
                       (&local_108,&local_190,(double *)&local_180,&local_188,&local_198);
        local_158.center.x = local_190;
        local_158.center.y = (double)local_180;
        local_158.axes.height = (int)ROUND(local_198);
        local_158.axes.width = (int)ROUND(local_188);
        std::vector<mEllipse,_std::allocator<mEllipse>_>::emplace_back<mEllipse>
                  (local_128,&local_158);
      }
      else {
        local_108.coeff[2] = *(double *)((long)(pCVar14->eq).coeff + lVar25 + -0x30);
        pdVar18 = (double *)((long)(pCVar14->eq).coeff + lVar25 + -0x40);
        local_108.coeff[0] = *pdVar18;
        local_108.coeff[1] = pdVar18[1];
        std::vector<mCircle,_std::allocator<mCircle>_>::emplace_back<mCircle>
                  (local_120,(mCircle *)&local_108);
      }
      lVar26 = lVar26 + 1;
      lVar25 = lVar25 + 0x98;
    } while (lVar26 < this->noCircles3);
  }
  pEVar20 = this->edarcs1;
  if (pEVar20 != (EDArcs *)0x0) {
    if (pEVar20->arcs != (MyArc *)0x0) {
      operator_delete__(pEVar20->arcs);
    }
    operator_delete(pEVar20);
  }
  pEVar20 = this->edarcs2;
  if (pEVar20 != (EDArcs *)0x0) {
    if (pEVar20->arcs != (MyArc *)0x0) {
      operator_delete__(pEVar20->arcs);
    }
    operator_delete(pEVar20);
  }
  pEVar20 = this->edarcs3;
  if (pEVar20 != (EDArcs *)0x0) {
    if (pEVar20->arcs != (MyArc *)0x0) {
      operator_delete__(pEVar20->arcs);
    }
    operator_delete(pEVar20);
  }
  pEVar20 = this->edarcs4;
  if (pEVar20 != (EDArcs *)0x0) {
    if (pEVar20->arcs != (MyArc *)0x0) {
      operator_delete__(pEVar20->arcs);
    }
    operator_delete(pEVar20);
  }
  if (this->circles1 != (Circle *)0x0) {
    operator_delete__(this->circles1);
  }
  if (this->circles2 != (Circle *)0x0) {
    operator_delete__(this->circles2);
  }
  if (this->circles3 != (Circle *)0x0) {
    operator_delete__(this->circles3);
  }
  pBVar17 = this->bm;
  if (pBVar17 != (BufferManager *)0x0) {
    BufferManager::~BufferManager(pBVar17);
    operator_delete(pBVar17);
  }
  if (this->segmentStartLines != (int *)0x0) {
    operator_delete__(this->segmentStartLines);
  }
  if (this->info != (Info *)0x0) {
    operator_delete__(this->info);
  }
  if (local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

EDCircles::EDCircles(Mat srcImage)
	: EDPF(srcImage)
{
	// Arcs & circles to be detected
	// If the end-points of the segment is very close to each other, 
	// then directly fit a circle/ellipse instread of line fitting
	noCircles1 = 0;
	circles1 = new Circle[(width + height) * 8];

	// ----------------------------------- DETECT LINES ---------------------------------
	int bufferSize = 0;
	for (int i = 0; i < segmentPoints.size(); i++) 
		bufferSize += (int)segmentPoints[i].size();

	// Compute the starting line number for each segment
	segmentStartLines = new int[segmentNos + 1];

	bm = new BufferManager(bufferSize * 8);
	vector<LineSegment> lines;


#define CIRCLE_MIN_LINE_LEN 6

	for (int i = 0; i < segmentNos; i++) {

		// Make note of the starting line number for this segment
		segmentStartLines[i] = (int)lines.size();

		int noPixels = (int)segmentPoints[i].size();

		if (noPixels < 2 * CIRCLE_MIN_LINE_LEN) 
			continue;

		double *x = bm->getX();
		double *y = bm->getY();

		for (int j = 0; j<noPixels; j++) {
			x[j] = segmentPoints[i][j].x;
			y[j] = segmentPoints[i][j].y;
		} //end-for

		  // If the segment is reasonably long, then see if the segment traverses the boundary of a closed shape
		if (noPixels >= 4 * CIRCLE_MIN_LINE_LEN) {
			// If the end-points of the segment is close to each other, then assume a circular/elliptic structure
			double dx = x[0] - x[noPixels - 1];
			double dy = y[0] - y[noPixels - 1];
			double d = sqrt(dx*dx + dy*dy);
			double r = noPixels / TWOPI;      // Assume a complete circle

			double maxDistanceBetweenEndPoints = MAX(3, r / 4);

			// If almost closed loop, then try to fit a circle/ellipse
			if (d <= maxDistanceBetweenEndPoints) {
				double xc, yc, r, circleFitError = 1e10;

				CircleFit(x, y, noPixels, &xc, &yc, &r, &circleFitError);

				EllipseEquation eq;
				double ellipseFitError = 1e10;

				if (circleFitError > LONG_ARC_ERROR) {
					// Try fitting an ellipse
					if (EllipseFit(x, y, noPixels, &eq)) 
						ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);
				} //end-if

				if (circleFitError <= LONG_ARC_ERROR) {
					addCircle(circles1, noCircles1, xc ,yc, r, circleFitError, x, y, noPixels);
					bm->move(noPixels);
					continue;

				}
				else if (ellipseFitError <= ELLIPSE_ERROR) {
					double major, minor;
					ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &major, &minor);

					// Assume major is longer. Otherwise, swap
					if (minor > major) { double tmp = major; major = minor; minor = tmp; }

					if (major < 8 * minor) {
						addCircle(circles1, noCircles1,xc, yc, r, circleFitError, &eq, ellipseFitError, x, y, noPixels);
						bm->move(noPixels);
					} //end-if

					continue;
				} //end-else
			} //end-if 
		} //end-if
		
		// Otherwise, split to lines
		EDLines::SplitSegment2Lines(x, y, noPixels, i, lines);
	}

	segmentStartLines[segmentNos] = (int)lines.size();

	// ------------------------------- DETECT ARCS ---------------------------------

	info = new Info[lines.size()];

	// Compute the angle information for each line segment
	for (int i = 0; i<segmentNos; i++) {
		for (int j = segmentStartLines[i]; j<segmentStartLines[i + 1]; j++) {
			LineSegment *l1 = &lines[j];
			LineSegment *l2;

			if (j == segmentStartLines[i + 1] - 1) l2 = &lines[segmentStartLines[i]];
			else                               l2 = &lines[j + 1];

#if 1
			// If the end points of the lines are far from each other, then stop at this line
			double dx = l1->ex - l2->sx;
			double dy = l1->ey - l2->sy;
			double d = sqrt(dx*dx + dy*dy);
			if (d >= 15) { info[j].angle = 10; info[j].sign = 2; info[j].taken = false; continue; }
#endif

			// Compute the angle between the lines & their turn direction
			double v1x = l1->ex - l1->sx;
			double v1y = l1->ey - l1->sy;
			double v1Len = sqrt(v1x*v1x + v1y*v1y);

			double v2x = l2->ex - l2->sx;
			double v2y = l2->ey - l2->sy;
			double v2Len = sqrt(v2x*v2x + v2y*v2y);

			double dotProduct = (v1x*v2x + v1y*v2y) / (v1Len*v2Len);
			if (dotProduct > 1.0) dotProduct = 1.0;
			else if (dotProduct < -1.0) dotProduct = -1.0;

			info[j].angle = acos(dotProduct);
			info[j].sign = (v1x*v2y - v2x*v1y) >= 0 ? 1 : -1;  // compute cross product
			info[j].taken = false;
		} //end-for
	} //end-for

	// This is how much space we will allocate for circles buffers
	int maxNoOfCircles = (int)lines.size() / 3 + noCircles1 * 2;

	edarcs1 = new EDArcs(maxNoOfCircles);
	DetectArcs(lines);    // Detect all arcs

	// Try to join arcs that are almost perfectly circular. 
	// Use the distance between the arc end-points as a metric in choosing in choosing arcs to join
	edarcs2 = new EDArcs(maxNoOfCircles);
	JoinArcs1();

	// Try to join arcs that belong to the same segment
	edarcs3 = new EDArcs(maxNoOfCircles);
	JoinArcs2();

	// Try to combine arcs that belong to different segments
	edarcs4 = new EDArcs(maxNoOfCircles);     // The remaining arcs
	JoinArcs3();

	// Finally, go over the arcs & circles, and generate candidate circles
	GenerateCandidateCircles();

	//----------------------------- VALIDATE CIRCLES --------------------------
	noCircles2 = 0;
	circles2 = new Circle[maxNoOfCircles];
	GaussianBlur(srcImage, smoothImage, Size(), 0.50); // calculate kernel from sigma;

	ValidateCircles();

	//----------------------------- JOIN CIRCLES --------------------------
	noCircles3 = 0;
	circles3 = new Circle[maxNoOfCircles];
	JoinCircles();

	noCircles = 0;
	noEllipses = 0;
	for (int i = 0; i < noCircles3; i++) {
		if (circles3[i].isEllipse)
			noEllipses++;
		else
			noCircles++;
	}

	for (int i = 0; i<noCircles3; i++) {
		if (circles3[i].isEllipse) {
			EllipseEquation eq = circles3[i].eq;
			double xc;
			double yc;
			double a;
			double b;
			double theta = ComputeEllipseCenterAndAxisLengths(&eq, &xc, &yc, &a, &b);
			ellipses.push_back(mEllipse(Point2d(xc, yc), Size2d(a, b), theta));

		}
		else {
			double r = circles3[i].r;
			double xc = circles3[i].xc;
			double yc = circles3[i].yc;

			circles.push_back(mCircle(Point2d(xc, yc), r));
			
		} //end-else
	} //end-for


	// clean up
	delete edarcs1;
	delete edarcs2;
	delete edarcs3;
	delete edarcs4;

	delete[] circles1;
	delete[] circles2;
	delete[] circles3;

	delete bm;
	delete[] segmentStartLines;
	delete[] info;
}